

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldTest_MoveConstruct_Test::TestBody
          (RepeatedPtrFieldTest_MoveConstruct_Test *this)

{
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*>_> matcher;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*>_> matcher_00;
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*>_> matcher_01;
  bool bVar1;
  pointer pbVar2;
  char *pcVar3;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  Arena *rhs;
  char *in_R9;
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffffd08;
  AssertHelper local_270;
  Message local_268;
  testing local_260 [8];
  _Tuple_impl<1UL,_const_char_*> _Stack_258;
  char local_250 [16];
  undefined1 local_240 [8];
  AssertionResult gtest_ar_4;
  Message local_228;
  testing local_220 [8];
  _Tuple_impl<1UL,_const_char_*> _Stack_218;
  char local_210 [16];
  undefined1 local_200 [8];
  AssertionResult gtest_ar_3;
  Message local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  destination_1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *source_1;
  Arena arena;
  AssertHelper local_e8;
  Message local_e0;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_;
  Message local_b8;
  testing local_b0 [8];
  _Tuple_impl<1UL,_const_char_*> _Stack_a8;
  char local_a0 [16];
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  destination;
  string **data;
  undefined1 local_28 [8];
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  source;
  RepeatedPtrFieldTest_MoveConstruct_Test *this_local;
  
  source.super_RepeatedPtrFieldBase.arena_ = (Arena *)this;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_28);
  pbVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_28);
  std::__cxx11::string::operator=((string *)pbVar2,"1");
  pbVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_28);
  std::__cxx11::string::operator=((string *)pbVar2,"2");
  destination.super_RepeatedPtrFieldBase.arena_ =
       (Arena *)RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::data((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_28);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar.message_,
                     (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_28);
  local_70 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::data((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const_*,_nullptr>
            ((EqHelper *)local_68,"data","destination.data()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)
             &destination.super_RepeatedPtrFieldBase.arena_,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,900,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  testing::ElementsAre<char[2],char[2]>(local_b0,(char (*) [2])0x1eb4591,(char (*) [2])0x1eed7d5);
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffffd08._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       _Stack_a8.super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*>>>
            (matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*>>>
  ::operator()(local_90,local_a0,
               (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x1dde6b5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x385,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_d1 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::empty((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_28);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&arena.impl_.first_arena_.cached_blocks_,(internal *)local_d0,
               (AssertionResult *)"source.empty()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x388,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&arena.impl_.first_arena_.cached_blocks_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar.message_);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_28);
  Arena::Arena((Arena *)&source_1);
  this_00 = Arena::Create<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                      ((Arena *)&source_1);
  pbVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add(this_00);
  std::__cxx11::string::operator=((string *)pbVar2,"1");
  pbVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add(this_00);
  std::__cxx11::string::operator=((string *)pbVar2,"2");
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar_2.message_,this_00);
  rhs = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::GetArena((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar_2.message_);
  testing::internal::EqHelper::Compare<google::protobuf::Arena>
            ((EqHelper *)local_1e0,"nullptr","destination.GetArena()",(nullptr_t)0x0,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x391,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  testing::ElementsAre<char[2],char[2]>(local_220,(char (*) [2])0x1eb4591,(char (*) [2])0x1eed7d5);
  matcher_00.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffffd08._M_head_impl;
  matcher_00.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       _Stack_218.super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*>>>
            (matcher_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*>>>
  ::operator()(local_200,local_210,
               (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x1dde6b5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x392,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  testing::ElementsAre<char[2],char[2]>(local_260,(char (*) [2])0x1eb4591,(char (*) [2])0x1eed7d5);
  matcher_01.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffffd08._M_head_impl;
  matcher_01.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       _Stack_258.super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*>>>
            (matcher_01);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*>>>
  ::operator()(local_240,local_250,
               (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)"*source");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x395,pcVar3);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_2.message_);
  Arena::~Arena((Arena *)&source_1);
  return;
}

Assistant:

TEST(RepeatedPtrFieldTest, MoveConstruct) {
  {
    RepeatedPtrField<std::string> source;
    *source.Add() = "1";
    *source.Add() = "2";
    const std::string* const* data = source.data();
    RepeatedPtrField<std::string> destination = std::move(source);
    EXPECT_EQ(data, destination.data());
    EXPECT_THAT(destination, ElementsAre("1", "2"));
    // This property isn't guaranteed but it's useful to have a test that would
    // catch changes in this area.
    EXPECT_TRUE(source.empty());
  }
  {
    Arena arena;
    RepeatedPtrField<std::string>* source =
        Arena::Create<RepeatedPtrField<std::string>>(&arena);
    *source->Add() = "1";
    *source->Add() = "2";
    RepeatedPtrField<std::string> destination = std::move(*source);
    EXPECT_EQ(nullptr, destination.GetArena());
    EXPECT_THAT(destination, ElementsAre("1", "2"));
    // This property isn't guaranteed but it's useful to have a test that would
    // catch changes in this area.
    EXPECT_THAT(*source, ElementsAre("1", "2"));
  }
}